

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.c
# Opt level: O3

int scan_buffer(d_loc_t *aloc,D_State *parse_state,ShiftResult *results)

{
  char **ppcVar1;
  uchar uVar2;
  byte bVar3;
  short sVar4;
  void *pvVar5;
  void *pvVar6;
  char *pcVar7;
  bool bVar8;
  char *pcVar9;
  SNode *pSVar10;
  D_Shift *pDVar11;
  char *pcVar12;
  undefined8 uVar13;
  long lVar14;
  ushort uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  D_Shift **ppDVar20;
  D_Shift **ppDVar21;
  ulong uVar22;
  long *plVar23;
  long *plVar24;
  ulong uVar25;
  d_loc_t *pdVar26;
  uint uVar27;
  int iVar28;
  char cVar29;
  int *piVar30;
  uint uVar31;
  int iVar32;
  int iVar33;
  uint uVar34;
  ushort uVar35;
  byte *pbVar36;
  uint uVar37;
  int iVar38;
  bool bVar39;
  int local_94;
  int local_90;
  byte *local_80;
  ulong local_78;
  char *local_48;
  char *pcStack_40;
  
  pbVar36 = (byte *)aloc->s;
  pcVar7 = aloc->pathname;
  pcVar9 = aloc->ws;
  local_90 = aloc->col;
  local_94 = aloc->line;
  local_48 = aloc->pathname;
  pcStack_40 = aloc->ws;
  uVar2 = parse_state->scanner_size;
  local_80 = pbVar36;
  if (uVar2 == '\x04') {
    pvVar5 = parse_state->scanner_table;
    bVar3 = *pbVar36;
    uVar18 = (ulong)(bVar3 >> 6);
    uVar25 = (ulong)(bVar3 & 0x3f);
    iVar38 = *(int *)(*(long *)((long)pvVar5 + uVar18 * 8 + 8) + uVar25 * 4);
    if (iVar38 == 0) {
      uVar27 = 0;
      local_78 = 0;
    }
    else {
      pvVar6 = parse_state->transition_table;
      uVar22 = 0;
      uVar37 = 0;
      local_78 = 0;
      uVar27 = 0;
      iVar28 = local_94;
      iVar32 = local_94;
      iVar16 = local_90;
      iVar33 = local_90;
      do {
        iVar19 = iVar28;
        if (((uVar37 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) &&
           (ppDVar20 = parse_state->accepts_diff
                       [*(uint *)(*(long *)((long)pvVar6 + uVar18 * 8 + uVar22 * 0x20) + uVar25 * 4)
                       ], *ppDVar20 != (D_Shift *)0x0)) {
          piVar30 = &results[(int)uVar27].loc.line;
          do {
            ppDVar21 = ppDVar20 + 1;
            ((d_loc_t *)(piVar30 + -7))->s = (char *)pbVar36;
            *(char **)(piVar30 + -5) = pcVar7;
            *(char **)(piVar30 + -3) = pcVar9;
            piVar30[-1] = iVar16;
            *piVar30 = iVar32;
            *(D_Shift **)(piVar30 + -9) = *ppDVar20;
            piVar30 = piVar30 + 0xc;
            uVar27 = uVar27 + 1;
            ppDVar20 = ppDVar21;
          } while (*ppDVar21 != (D_Shift *)0x0);
        }
        pbVar36 = pbVar36 + 1;
        uVar37 = iVar38 - 1;
        uVar22 = (ulong)uVar37;
        if (*(long *)((long)pvVar5 + uVar22 * 0x28) != 0) {
          local_78 = (ulong)uVar37;
          local_94 = iVar19;
          local_80 = pbVar36;
          local_48 = pcVar7;
          pcStack_40 = pcVar9;
          local_90 = iVar33;
        }
        iVar17 = iVar33 + 1;
        bVar39 = bVar3 == 10;
        if (bVar39) {
          iVar17 = 0;
        }
        bVar3 = *pbVar36;
        uVar18 = (ulong)(bVar3 >> 6);
        uVar25 = (ulong)(bVar3 & 0x3f);
        iVar38 = *(int *)(*(long *)((long)pvVar5 + uVar18 * 8 + uVar22 * 0x28 + 8) + uVar25 * 4);
        iVar28 = (uint)bVar39 + iVar19;
        iVar32 = iVar19;
        iVar16 = iVar33;
        iVar33 = iVar17;
      } while (iVar38 != 0);
    }
    plVar23 = (long *)((long)pvVar5 + local_78 * 0x28);
  }
  else if (uVar2 == '\x02') {
    pvVar5 = parse_state->scanner_table;
    bVar3 = *pbVar36;
    uVar37 = (uint)bVar3;
    uVar25 = (ulong)(bVar3 >> 6);
    uVar18 = (ulong)(bVar3 & 0x3f);
    sVar4 = *(short *)(*(long *)((long)pvVar5 + uVar25 * 8 + 8) + uVar18 * 2);
    if (sVar4 == 0) {
      uVar27 = 0;
      uVar25 = 0;
    }
    else {
      pvVar6 = parse_state->transition_table;
      uVar22 = 0;
      uVar35 = 0;
      uVar15 = 0;
      uVar27 = 0;
      iVar38 = local_94;
      iVar28 = local_90;
      iVar32 = local_90;
      iVar16 = local_94;
      do {
        if (((uVar35 != 0) && (parse_state->accepts_diff != (D_Shift ***)0x0)) &&
           (ppDVar20 = parse_state->accepts_diff
                       [*(ushort *)
                         (*(long *)((long)pvVar6 + uVar25 * 8 + uVar22 * 0x20) + uVar18 * 2)],
           *ppDVar20 != (D_Shift *)0x0)) {
          piVar30 = &results[(int)uVar27].loc.line;
          do {
            ppDVar21 = ppDVar20 + 1;
            ((d_loc_t *)(piVar30 + -7))->s = (char *)pbVar36;
            *(char **)(piVar30 + -5) = pcVar7;
            *(char **)(piVar30 + -3) = pcVar9;
            piVar30[-1] = iVar28;
            *piVar30 = iVar38;
            *(D_Shift **)(piVar30 + -9) = *ppDVar20;
            piVar30 = piVar30 + 0xc;
            uVar27 = uVar27 + 1;
            ppDVar20 = ppDVar21;
          } while (*ppDVar21 != (D_Shift *)0x0);
        }
        pbVar36 = pbVar36 + 1;
        uVar35 = sVar4 - 1;
        uVar22 = (ulong)uVar35;
        if (*(long *)((long)pvVar5 + uVar22 * 0x28) != 0) {
          local_94 = iVar16;
          local_80 = pbVar36;
          local_48 = pcVar7;
          pcStack_40 = pcVar9;
          local_90 = iVar32;
          uVar15 = uVar35;
        }
        iVar33 = iVar32 + 1;
        bVar39 = (char)uVar37 == '\n';
        if (bVar39) {
          iVar33 = 0;
        }
        uVar37 = (uint)*pbVar36;
        uVar25 = (ulong)(*pbVar36 >> 6);
        uVar18 = (ulong)(uVar37 & 0x3f);
        sVar4 = *(short *)(*(long *)((long)pvVar5 + uVar25 * 8 + uVar22 * 0x28 + 8) + uVar18 * 2);
        iVar38 = iVar16;
        iVar28 = iVar32;
        iVar32 = iVar33;
        iVar16 = (uint)bVar39 + iVar16;
      } while (sVar4 != 0);
      uVar25 = (ulong)uVar15;
    }
    plVar23 = (long *)((long)pvVar5 + uVar25 * 0x28);
  }
  else {
    if (uVar2 != '\x01') {
      return 0;
    }
    pvVar5 = parse_state->scanner_table;
    bVar3 = *pbVar36;
    uVar37 = (uint)bVar3;
    uVar25 = (ulong)(bVar3 >> 6);
    uVar18 = (ulong)(bVar3 & 0x3f);
    cVar29 = *(char *)(*(long *)((long)pvVar5 + uVar25 * 8 + 8) + uVar18);
    if (cVar29 == '\0') {
      uVar25 = 0;
      uVar27 = 0;
    }
    else {
      pvVar6 = parse_state->transition_table;
      uVar27 = 0;
      uVar22 = 0;
      uVar34 = 0;
      iVar38 = local_90;
      iVar28 = local_94;
      do {
        if ((((char)uVar22 != '\0') && (parse_state->accepts_diff != (D_Shift ***)0x0)) &&
           (ppDVar20 = parse_state->accepts_diff
                       [*(byte *)(*(long *)((long)pvVar6 + uVar25 * 8 + uVar22 * 0x20) + uVar18)],
           *ppDVar20 != (D_Shift *)0x0)) {
          piVar30 = &results[(int)uVar27].loc.line;
          do {
            ppDVar21 = ppDVar20 + 1;
            ((d_loc_t *)(piVar30 + -7))->s = (char *)pbVar36;
            *(char **)(piVar30 + -5) = pcVar7;
            *(char **)(piVar30 + -3) = pcVar9;
            piVar30[-1] = iVar38;
            *piVar30 = iVar28;
            *(D_Shift **)(piVar30 + -9) = *ppDVar20;
            piVar30 = piVar30 + 0xc;
            uVar27 = uVar27 + 1;
            ppDVar20 = ppDVar21;
          } while (*ppDVar21 != (D_Shift *)0x0);
        }
        pbVar36 = pbVar36 + 1;
        uVar22 = (ulong)(byte)(cVar29 - 1U);
        iVar38 = iVar38 + 1;
        bVar39 = (char)uVar37 == '\n';
        if (bVar39) {
          iVar38 = 0;
        }
        iVar28 = iVar28 + (uint)bVar39;
        if (*(long *)((long)pvVar5 + uVar22 * 0x28) != 0) {
          uVar34 = (uint)(byte)(cVar29 - 1U);
          local_90 = iVar38;
          local_94 = iVar28;
          local_80 = pbVar36;
          local_48 = pcVar7;
          pcStack_40 = pcVar9;
        }
        uVar37 = (uint)*pbVar36;
        uVar25 = (ulong)(*pbVar36 >> 6);
        uVar18 = (ulong)(uVar37 & 0x3f);
        cVar29 = *(char *)(*(long *)((long)pvVar5 + uVar25 * 8 + uVar22 * 0x28 + 8) + uVar18);
      } while (cVar29 != '\0');
      uVar25 = (ulong)uVar34;
    }
    plVar23 = (long *)((long)pvVar5 + uVar25 * 0x28);
  }
  uVar37 = 0;
  plVar23 = (long *)*plVar23;
  if ((plVar23 != (long *)0x0) && (*plVar23 != 0)) {
    piVar30 = &results[(int)uVar27].loc.line;
    do {
      plVar24 = plVar23 + 1;
      ((d_loc_t *)(piVar30 + -7))->s = (char *)local_80;
      *(char **)(piVar30 + -5) = local_48;
      *(char **)(piVar30 + -3) = pcStack_40;
      piVar30[-1] = local_90;
      *piVar30 = local_94;
      *(long *)(piVar30 + -9) = *plVar23;
      piVar30 = piVar30 + 0xc;
      uVar27 = uVar27 + 1;
      plVar23 = plVar24;
    } while (*plVar24 != 0);
  }
  if (uVar27 == 0) {
    return 0;
  }
  uVar25 = (ulong)(uVar27 - 1);
  pcVar7 = results[(int)(uVar27 - 1)].loc.s;
  if (parse_state->scan_kind == '\x01') {
LAB_001469c3:
    if (0 < (int)uVar27) {
      pdVar26 = &results->loc;
      uVar25 = 0;
      uVar37 = 0;
      do {
        if ((pdVar26->s == pcVar7) ||
           (*(char *)(*(long *)((long)(pdVar26 + -1) + 0x18) + 2) == '\x03')) {
          if (uVar25 != uVar37) {
            pSVar10 = *(SNode **)((long)(pdVar26 + -1) + 0x10);
            pDVar11 = *(D_Shift **)((long)(pdVar26 + -1) + 0x18);
            pcVar9 = pdVar26->s;
            pcVar12 = pdVar26->pathname;
            uVar13 = *(undefined8 *)&pdVar26->col;
            ppcVar1 = &results[(int)uVar37].loc.ws;
            *ppcVar1 = pdVar26->ws;
            ppcVar1[1] = (char *)uVar13;
            results[(int)uVar37].loc.s = pcVar9;
            results[(int)uVar37].loc.pathname = pcVar12;
            results[(int)uVar37].snode = pSVar10;
            results[(int)uVar37].shift = pDVar11;
          }
          uVar37 = uVar37 + 1;
        }
        uVar25 = uVar25 + 1;
        pdVar26 = (d_loc_t *)((long)(pdVar26 + 1) + 0x10);
      } while (uVar27 != uVar25);
    }
  }
  else {
    if (parse_state->scan_kind != '\x02') {
      return uVar27;
    }
    if (0 < (int)uVar27) {
      bVar39 = false;
      uVar34 = uVar27;
      do {
        uVar25 = (ulong)(uVar34 - 1);
        if (results[uVar25].loc.s < pcVar7) goto LAB_001469bf;
        if ((results[uVar25].shift)->shift_kind == '\x01') {
          bVar39 = true;
        }
        uVar31 = uVar34 - 1;
        bVar8 = 0 < (int)uVar34;
        uVar34 = uVar31;
      } while (uVar31 != 0 && bVar8);
      uVar25 = 0xffffffff;
LAB_001469bf:
      if (bVar39) goto LAB_001469c3;
    }
    uVar34 = (uint)uVar25;
    if (-1 < (int)uVar34) {
      ppDVar20 = &results[uVar25].shift;
      uVar18 = uVar25;
      do {
        if ((*ppDVar20)->shift_kind != '\x01') {
          iVar38 = (int)uVar25;
          if (uVar18 != uVar25) {
            pSVar10 = ((ShiftResult *)(ppDVar20 + -1))->snode;
            pDVar11 = *ppDVar20;
            pcVar7 = ((d_loc_t *)(ppDVar20 + 1))->s;
            pcVar9 = (char *)ppDVar20[2];
            lVar14 = (long)ppDVar20[4];
            ppcVar1 = &results[iVar38].loc.ws;
            *ppcVar1 = (char *)ppDVar20[3];
            ppcVar1[1] = (char *)lVar14;
            results[iVar38].loc.s = pcVar7;
            results[iVar38].loc.pathname = pcVar9;
            results[iVar38].snode = pSVar10;
            results[iVar38].shift = pDVar11;
          }
          uVar25 = (ulong)(iVar38 - 1);
        }
        uVar34 = (uint)uVar25;
        ppDVar20 = ppDVar20 + -6;
        bVar39 = 0 < (long)uVar18;
        uVar18 = uVar18 - 1;
      } while (bVar39);
    }
    uVar37 = uVar27 + ~uVar34;
    if (uVar34 != 0xffffffff) {
      memmove(results,results + (long)(int)uVar34 + 1,(long)(int)uVar37 * 0x30);
    }
  }
  return uVar37;
}

Assistant:

int scan_buffer(d_loc_t *aloc, D_State *parse_state, ShiftResult *results) {
  d_loc_t loc = *aloc, last_loc = *aloc;
  char *s = loc.s;
  int col = loc.col, line = loc.line;
  int nresults = 0, i = 0, j;
  D_Shift **shift = NULL, **shift_diff = 0;

  switch (parse_state->scanner_size) {
    case 1: {
      /* all matches */
      SB_uint8 *st = (SB_uint8 *)parse_state->scanner_table;
      SB_trans_uint8 *tst = (SB_trans_uint8 *)parse_state->transition_table;
      uint8 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 2: {
      /* all matches */
      SB_uint16 *st = (SB_uint16 *)parse_state->scanner_table;
      SB_trans_uint16 *tst = (SB_trans_uint16 *)parse_state->transition_table;
      uint16 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
    case 4: {
      /* all matches */
      SB_uint32 *st = (SB_uint32 *)parse_state->scanner_table;
      SB_trans_uint32 *tst = (SB_trans_uint32 *)parse_state->transition_table;
      uint32 state = 0, last = state, prev = state;
      uint8 c;
      uint32 sb, so;
      c = (uint8)*s++;
      while ((state = st[state].scanner_block[(sb = (c >> SCANNER_BLOCK_SHIFT))][(so = c & SCANNER_BLOCK_MASK)])) {
        state -= 1;
        if (prev && parse_state->accepts_diff) {
          shift_diff = parse_state->accepts_diff[tst[prev].scanner_block[sb][so]];
          for (; *shift_diff; shift_diff++) {
            results[nresults].loc = loc;
            results[nresults++].shift = *shift_diff;
          }
        }
        prev = state;
        loc.s = s;
        loc.line = line;
        loc.col = col;
        if (st[state].shift) {
          last = state;
          last_loc = loc;
        }
        if (c == '\n') {
          line++;
          col = 0;
        } else
          col++;
        c = (uint8)*s++;
      }
      shift = st[last].shift;
      break;
    }
  }
  if (shift) {
    for (; *shift; shift++) {
      results[nresults].loc = last_loc;
      results[nresults++].shift = *shift;
    }
  }
  if (nresults) {
    int longest = 0;
    char *end = results[nresults - 1].loc.s;
    if (parse_state->scan_kind == D_SCAN_LONGEST) longest = 1;
    if (parse_state->scan_kind == D_SCAN_MIXED) {
      for (i = nresults - 1; i >= 0; i--) {
        if (results[i].loc.s < end) break;
        if (results[i].shift->shift_kind == D_SCAN_LONGEST) longest = 1;
      }
    }
    if (longest) {
      /* keep only 'longest' */
      i = 0;
      for (j = 0; j < nresults; j++) {
        if (results[j].loc.s == end || results[j].shift->shift_kind == D_SCAN_TRAILING) {
          if (i != j) results[i] = results[j];
          i++;
        }
      }
      nresults = i;
    } else if (parse_state->scan_kind == D_SCAN_MIXED) {
      /* only keep non-longest */
      for (j = i; j >= 0; j--)
        if (results[j].shift->shift_kind != D_SCAN_LONGEST) {
          if (i != j) results[i] = results[j];
          i--;
        }
      nresults = nresults - i - 1;
      if (i != -1) memmove(&results[0], &results[i + 1], nresults * sizeof(results[0]));
    }
  }
  return nresults;
}